

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emu2149.c
# Opt level: O2

void EPSG_calc_stereo(EPSG *psg,UINT32 samples,DEV_SMPL **out)

{
  uint uVar1;
  DEV_SMPL *pDVar2;
  DEV_SMPL *pDVar3;
  uint uVar4;
  undefined8 in_RAX;
  ulong uVar5;
  int32_t buffers [2];
  undefined8 local_38;
  
  pDVar2 = *out;
  pDVar3 = out[1];
  if (psg->quality == 0) {
    local_38 = in_RAX;
    for (uVar5 = 0; samples != uVar5; uVar5 = uVar5 + 1) {
      update_output(psg);
      mix_output_stereo(psg,(int32_t *)&local_38);
      pDVar2[uVar5] = (DEV_SMPL)local_38;
      pDVar3[uVar5] = local_38._4_4_;
    }
  }
  else {
    for (uVar5 = 0; uVar5 != samples; uVar5 = uVar5 + 1) {
      while( true ) {
        uVar1 = psg->psgtime;
        uVar4 = uVar1 - psg->realstep;
        if (psg->realstep <= uVar1) break;
        psg->psgtime = uVar1 + psg->psgstep;
        *(undefined8 *)psg->sprev = *(undefined8 *)psg->snext;
        update_output(psg);
        mix_output_stereo(psg,psg->snext);
      }
      psg->psgtime = uVar4;
      pDVar2[uVar5] =
           (int)(((double)uVar4 * (double)psg->sprev[0] +
                 (double)(psg->psgstep - uVar4) * (double)psg->snext[0]) / (double)psg->psgstep);
      pDVar3[uVar5] =
           (int)(((double)psg->psgtime * (double)psg->sprev[1] +
                 (double)(psg->psgstep - psg->psgtime) * (double)psg->snext[1]) /
                (double)psg->psgstep);
    }
  }
  return;
}

Assistant:

void
EPSG_calc_stereo (EPSG * psg, UINT32 samples, DEV_SMPL **out)
{
  DEV_SMPL *bufMO = out[0];
  DEV_SMPL *bufRO = out[1];
  int32_t buffers[2];
  UINT32 i;

  if (!psg->quality)
  {
    for (i = 0; i < samples; i ++)
    {
      update_output(psg);
      mix_output_stereo(psg, buffers);
      bufMO[i] = buffers[0];
      bufRO[i] = buffers[1];
    }
  }
  else
  {
    for (i = 0; i < samples; i ++)
    {
      while (psg->realstep > psg->psgtime)
      { 
        psg->psgtime += psg->psgstep;
        psg->sprev[0] = psg->snext[0];
        psg->sprev[1] = psg->snext[1];
        update_output(psg);
        mix_output_stereo(psg, psg->snext);
      }

      psg->psgtime -= psg->realstep;
      bufMO[i] = (DEV_SMPL) (((double) psg->snext[0] * (psg->psgstep - psg->psgtime)
                            + (double) psg->sprev[0] * psg->psgtime) / psg->psgstep);
      bufRO[i] = (DEV_SMPL) (((double) psg->snext[1] * (psg->psgstep - psg->psgtime)
                            + (double) psg->sprev[1] * psg->psgtime) / psg->psgstep);
    }
  }
}